

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::setControlUpperBound
          (OptimalControlProblem *this,VectorDynSize *maxControl)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  __shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_28;
  
  if ((this->m_pimpl->dynamicalSystem).
      super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    pcVar3 = "First a dynamical system has to be set.";
  }
  else {
    sVar1 = iDynTree::VectorDynSize::size();
    sVar2 = DynamicalSystem::controlSpaceSize
                      ((this->m_pimpl->dynamicalSystem).
                       super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar1 == sVar2) {
      this->m_pimpl->controlUpperBounded = true;
      std::
      make_shared<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>,iDynTree::VectorDynSize_const&>
                ((VectorDynSize *)&_Stack_28);
      std::
      __shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,(__gnu_cxx::_Lock_policy)2>
      ::operator=((__shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,(__gnu_cxx::_Lock_policy)2>
                   *)&this->m_pimpl->controlUpperBound,&_Stack_28);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
      return true;
    }
    pcVar3 = "The dimension of maxControl does not coincide with the control dimension.";
  }
  iDynTree::reportError("OptimalControlProblem","setControlUpperBound",pcVar3);
  return false;
}

Assistant:

bool OptimalControlProblem::setControlUpperBound(const VectorDynSize &maxControl)
        {
            if (!(m_pimpl->dynamicalSystem)){
                reportError("OptimalControlProblem", "setControlUpperBound", "First a dynamical system has to be set.");
                return false;
            }

            if (maxControl.size() != m_pimpl->dynamicalSystem->controlSpaceSize()) {
                reportError("OptimalControlProblem", "setControlUpperBound", "The dimension of maxControl does not coincide with the control dimension.");
                return false;
            }

            m_pimpl->controlUpperBounded = true;
            m_pimpl->controlUpperBound = std::make_shared<TimeInvariantVector>(maxControl);

            return true;
        }